

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O1

art_val_t * art_find(art_t *art,art_key_chunk_t *key)

{
  byte bVar1;
  bool bVar2;
  uint8_t offset;
  art_inner_node_t *paVar3;
  long lVar4;
  ulong uVar5;
  art_inner_node_t *node;
  art_val_t *paVar6;
  ulong uVar7;
  byte bVar8;
  
  node = (art_inner_node_t *)art->root;
  if (node != (art_inner_node_t *)0x0) {
    bVar8 = 0;
    do {
      if (((ulong)node & 1) != 0) {
        paVar6 = (art_val_t *)((ulong)node & 0xfffffffffffffffe);
        if (5 < bVar8) {
          return paVar6;
        }
        lVar4 = 0;
        do {
          if (paVar6->key[lVar4] != key[lVar4]) {
            if (lVar4 == 6) {
              return paVar6;
            }
            return (art_val_t *)0x0;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != 6);
        return paVar6;
      }
      bVar1 = node->prefix_size;
      uVar5 = (ulong)(byte)(6 - bVar8);
      if (bVar1 <= (byte)(6 - bVar8)) {
        uVar5 = (ulong)bVar1;
      }
      if ((char)uVar5 == '\0') {
        uVar5 = 0;
      }
      else {
        uVar7 = 0;
        do {
          if (node->prefix[uVar7] != key[(uint)bVar8 + (int)uVar7]) {
            uVar5 = uVar7 & 0xffffffff;
            break;
          }
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      if (((byte)uVar5 == bVar1) &&
         (paVar3 = (art_inner_node_t *)art_find_child(node,key[(ulong)bVar8 + (ulong)bVar1]),
         paVar3 != (art_inner_node_t *)0x0)) {
        bVar8 = bVar8 + bVar1 + 1;
        bVar2 = true;
        node = paVar3;
      }
      else {
        bVar2 = false;
      }
    } while (bVar2);
  }
  return (art_val_t *)0x0;
}

Assistant:

art_val_t *art_find(const art_t *art, const art_key_chunk_t *key) {
    if (art->root == NULL) {
        return NULL;
    }
    return art_find_at(art->root, key, 0);
}